

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

QRectF * __thiscall
QGraphicsPathItem::boundingRect(QRectF *__return_storage_ptr__,QGraphicsPathItem *this)

{
  ExtraStruct **ppEVar1;
  double dVar2;
  QGraphicsItemPrivate *pQVar3;
  bool bVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  qsizetype qVar11;
  int iVar12;
  QAbstractGraphicsShapeItemPrivate *d;
  long in_FS_OFFSET;
  QPainterPath aQStack_68 [8];
  ExtraStruct *local_60;
  qsizetype qStack_58;
  qreal local_50;
  qreal qStack_48;
  QPen local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (this->super_QAbstractGraphicsShapeItem).super_QGraphicsItem.d_ptr.d;
  ppEVar1 = &pQVar3[1].extras.d.ptr;
  dVar2 = pQVar3[1].childrenBoundingRect.xp;
  if ((((dVar2 == 0.0) && (!NAN(dVar2))) &&
      (dVar2 = pQVar3[1].childrenBoundingRect.yp, dVar2 == 0.0)) && (!NAN(dVar2))) {
    QPen::QPen((QPen *)&local_60,(QPen *)&pQVar3[1].extras);
    iVar12 = QPen::style();
    if (iVar12 == 0) {
      bVar4 = true;
    }
    else {
      QPen::QPen(local_40,(QPen *)&(this->super_QAbstractGraphicsShapeItem).super_QGraphicsItem.
                                   d_ptr.d[1].extras);
      dVar2 = (double)QPen::widthF();
      bVar4 = dVar2 == 0.0;
      QPen::~QPen(local_40);
    }
    QPen::~QPen((QPen *)&local_60);
    if (bVar4) {
      QPainterPath::controlPointRect();
      pQVar3[1].childrenBoundingRect.xp = local_50;
      pQVar3[1].childrenBoundingRect.yp = qStack_48;
      *ppEVar1 = local_60;
      pQVar3[1].extras.d.size = qStack_58;
    }
    else {
      (*(this->super_QAbstractGraphicsShapeItem).super_QGraphicsItem._vptr_QGraphicsItem[4])
                (aQStack_68,this);
      QPainterPath::controlPointRect();
      pQVar3[1].childrenBoundingRect.xp = local_50;
      pQVar3[1].childrenBoundingRect.yp = qStack_48;
      *ppEVar1 = local_60;
      pQVar3[1].extras.d.size = qStack_58;
      QPainterPath::~QPainterPath(aQStack_68);
    }
  }
  uVar5 = *(undefined4 *)ppEVar1;
  uVar6 = *(undefined4 *)((long)&pQVar3[1].extras.d.ptr + 4);
  qVar11 = pQVar3[1].extras.d.size;
  uVar7 = *(undefined4 *)((long)&pQVar3[1].extras.d.size + 4);
  uVar8 = *(undefined4 *)((long)&pQVar3[1].childrenBoundingRect.xp + 4);
  uVar9 = *(undefined4 *)&pQVar3[1].childrenBoundingRect.yp;
  uVar10 = *(undefined4 *)((long)&pQVar3[1].childrenBoundingRect.yp + 4);
  *(undefined4 *)&__return_storage_ptr__->w = *(undefined4 *)&pQVar3[1].childrenBoundingRect.xp;
  *(undefined4 *)((long)&__return_storage_ptr__->w + 4) = uVar8;
  *(undefined4 *)&__return_storage_ptr__->h = uVar9;
  *(undefined4 *)((long)&__return_storage_ptr__->h + 4) = uVar10;
  *(undefined4 *)&__return_storage_ptr__->xp = uVar5;
  *(undefined4 *)((long)&__return_storage_ptr__->xp + 4) = uVar6;
  *(int *)&__return_storage_ptr__->yp = (int)qVar11;
  *(undefined4 *)((long)&__return_storage_ptr__->yp + 4) = uVar7;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QRectF QGraphicsPathItem::boundingRect() const
{
    Q_D(const QGraphicsPathItem);
    if (d->boundingRect.isNull()) {
        qreal pw = pen().style() == Qt::NoPen ? qreal(0) : pen().widthF();
        if (pw == 0.0)
            d->boundingRect = d->path.controlPointRect();
        else {
            d->boundingRect = shape().controlPointRect();
        }
    }
    return d->boundingRect;
}